

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O2

void xc_mgga_sanity_check(xc_func_info_type *info,int order,xc_mgga_out_params *out)

{
  uint uVar1;
  char *__format;
  char *pcVar2;
  size_t sStack_10;
  
  if (4 < (uint)order) {
    fprintf(_stderr,"Order of derivatives \'%d\' not implemented\n",(ulong)(uint)order);
    goto LAB_007e2c9d;
  }
  if ((out->zk == (double *)0x0) || ((info->flags & 1) != 0)) {
    if (out->vrho == (double *)0x0) {
LAB_007e2284:
      if (out->v2rho2 == (double *)0x0) goto LAB_007e2311;
      uVar1 = info->flags;
      if ((uVar1 & 4) != 0) {
        if (out->v2rhosigma == (double *)0x0) {
          pcVar2 = "error: output variable, out->v2rhosigma, is a null pointer\n";
          goto LAB_007e2c92;
        }
        if (out->v2sigma2 == (double *)0x0) {
          pcVar2 = "error: output variable, out->v2sigma2, is a null pointer\n";
LAB_007e2850:
          sStack_10 = 0x39;
        }
        else if ((short)uVar1 < 0) {
          if (out->v2rholapl == (double *)0x0) {
            pcVar2 = "error: output variable, out->v2rholapl, is a null pointer\n";
            goto LAB_007e2b68;
          }
          if (out->v2sigmalapl == (double *)0x0) {
            pcVar2 = "error: output variable, out->v2sigmalapl, is a null pointer\n";
            goto LAB_007e2c7d;
          }
          if (out->v2lapl2 != (double *)0x0) goto LAB_007e22d6;
          pcVar2 = "error: output variable, out->v2lapl2, is a null pointer\n";
LAB_007e2ad0:
          sStack_10 = 0x38;
        }
        else {
LAB_007e22d6:
          if ((uVar1 >> 0x10 & 1) != 0) {
            if (out->v2rhotau == (double *)0x0) {
              pcVar2 = "error: output variable, out->v2rhotau, is a null pointer\n";
              goto LAB_007e2850;
            }
            if (out->v2sigmatau == (double *)0x0) {
              pcVar2 = "error: output variable, out->v2sigmatau, is a null pointer\n";
              goto LAB_007e2c92;
            }
            if (out->v2tau2 == (double *)0x0) {
              pcVar2 = "error: output variable, out->v2tau2, is a null pointer\n";
              goto LAB_007e2b50;
            }
            if (((~uVar1 & 0x18000) == 0) && (out->v2lapltau == (double *)0x0)) {
              pcVar2 = "error: output variable, out->v2lapltau, is a null pointer\n";
              goto LAB_007e2b68;
            }
          }
LAB_007e2311:
          if (out->v3rho3 == (double *)0x0) goto LAB_007e2449;
          uVar1 = info->flags;
          if ((uVar1 & 8) == 0) {
            pcVar2 = info->name;
            __format = "Functional \'%s\' does not provide an implementation of kxc\n";
            goto LAB_007e277f;
          }
          if (out->v3rho2sigma == (double *)0x0) {
            pcVar2 = "error: output variable, out->v3rho2sigma, is a null pointer\n";
          }
          else {
            if (out->v3rhosigma2 != (double *)0x0) {
              if (out->v3sigma3 == (double *)0x0) {
                pcVar2 = "error: output variable, out->v3sigma3, is a null pointer\n";
                goto LAB_007e2850;
              }
              if ((short)uVar1 < 0) {
                if (out->v3rho2lapl == (double *)0x0) {
                  pcVar2 = "error: output variable, out->v3rho2lapl, is a null pointer\n";
                }
                else {
                  if (out->v3rhosigmalapl == (double *)0x0) {
                    pcVar2 = "error: output variable, out->v3rhosigmalapl, is a null pointer\n";
                    goto LAB_007e2b98;
                  }
                  if (out->v3rholapl2 != (double *)0x0) {
                    if (out->v3sigma2lapl == (double *)0x0) {
                      pcVar2 = "error: output variable, out->v3sigma2lapl, is a null pointer\n";
                    }
                    else {
                      if (out->v3sigmalapl2 != (double *)0x0) {
                        if (out->v3lapl3 == (double *)0x0) {
                          pcVar2 = "error: output variable, out->v3lapl3, is a null pointer\n";
                          goto LAB_007e2ad0;
                        }
                        goto LAB_007e23aa;
                      }
                      pcVar2 = "error: output variable, out->v3sigmalapl2, is a null pointer\n";
                    }
                    goto LAB_007e2b80;
                  }
                  pcVar2 = "error: output variable, out->v3rholapl2, is a null pointer\n";
                }
                goto LAB_007e2c92;
              }
LAB_007e23aa:
              if ((uVar1 >> 0x10 & 1) == 0) goto LAB_007e2449;
              if (out->v3rho2tau == (double *)0x0) {
                pcVar2 = "error: output variable, out->v3rho2tau, is a null pointer\n";
              }
              else {
                if (out->v3rhosigmatau == (double *)0x0) {
                  pcVar2 = "error: output variable, out->v3rhosigmatau, is a null pointer\n";
                  goto LAB_007e2c1a;
                }
                if (out->v3rhotau2 != (double *)0x0) {
                  if (out->v3sigma2tau == (double *)0x0) {
                    pcVar2 = "error: output variable, out->v3sigma2tau, is a null pointer\n";
                  }
                  else if (out->v3sigmatau2 == (double *)0x0) {
                    pcVar2 = "error: output variable, out->v3sigmatau2, is a null pointer\n";
                  }
                  else {
                    if (out->v3tau3 == (double *)0x0) {
                      pcVar2 = "error: output variable, out->v3tau3, is a null pointer\n";
                      goto LAB_007e2b50;
                    }
                    if ((~uVar1 & 0x18000) == 0) {
                      if (out->v3rholapltau == (double *)0x0) {
                        pcVar2 = "error: output variable, out->v3rholapltau, is a null pointer\n";
                        goto LAB_007e2b80;
                      }
                      if (out->v3sigmalapltau == (double *)0x0) {
                        pcVar2 = "error: output variable, out->v3sigmalapltau, is a null pointer\n";
                        goto LAB_007e2b98;
                      }
                      if (out->v3lapl2tau == (double *)0x0) {
                        pcVar2 = "error: output variable, out->v3lapl2tau, is a null pointer\n";
                      }
                      else {
                        if (out->v3lapltau2 != (double *)0x0) goto LAB_007e2449;
                        pcVar2 = "error: output variable, out->v3lapltau2, is a null pointer\n";
                      }
                      goto LAB_007e2c92;
                    }
LAB_007e2449:
                    if (out->v4rho4 == (double *)0x0) {
                      return;
                    }
                    uVar1 = info->flags;
                    if ((uVar1 & 0x10) == 0) {
                      pcVar2 = info->name;
                      __format = "Functional \'%s\' does not provide an implementation of lxc\n";
                      goto LAB_007e277f;
                    }
                    if (out->v4rho3sigma == (double *)0x0) {
                      pcVar2 = "error: output variable, out->v4rho3sigma, is a null pointer\n";
                    }
                    else {
                      if (out->v4rho2sigma2 == (double *)0x0) {
                        pcVar2 = "error: output variable, out->v4rho2sigma2, is a null pointer\n";
                        goto LAB_007e2b80;
                      }
                      if (out->v4rhosigma3 != (double *)0x0) {
                        if (out->v4sigma4 == (double *)0x0) {
                          pcVar2 = "error: output variable, out->v4sigma4, is a null pointer\n";
                          goto LAB_007e2850;
                        }
                        if ((short)uVar1 < 0) {
                          if (out->v4rho3lapl != (double *)0x0) {
                            if (out->v4rho2sigmalapl == (double *)0x0) {
                              pcVar2 = 
                              "error: output variable, out->v4rho2sigmalapl, is a null pointer\n";
                            }
                            else {
                              if (out->v4rho2lapl2 == (double *)0x0) {
                                pcVar2 = 
                                "error: output variable, out->v4rho2lapl2, is a null pointer\n";
                                goto LAB_007e2c7d;
                              }
                              if (out->v4rhosigma2lapl == (double *)0x0) {
                                pcVar2 = 
                                "error: output variable, out->v4rhosigma2lapl, is a null pointer\n";
                              }
                              else {
                                if (out->v4rhosigmalapl2 != (double *)0x0) {
                                  if (out->v4rholapl3 != (double *)0x0) {
                                    if (out->v4sigma3lapl == (double *)0x0) {
                                      pcVar2 = 
                                      "error: output variable, out->v4sigma3lapl, is a null pointer\n"
                                      ;
                                    }
                                    else {
                                      if (out->v4sigma2lapl2 == (double *)0x0) {
                                        pcVar2 = 
                                        "error: output variable, out->v4sigma2lapl2, is a null pointer\n"
                                        ;
                                        goto LAB_007e2c1a;
                                      }
                                      if (out->v4sigmalapl3 != (double *)0x0) {
                                        if (out->v4lapl4 == (double *)0x0) {
                                          pcVar2 = 
                                          "error: output variable, out->v4lapl4, is a null pointer\n"
                                          ;
                                          goto LAB_007e2ad0;
                                        }
                                        goto LAB_007e252f;
                                      }
                                      pcVar2 = 
                                      "error: output variable, out->v4sigmalapl3, is a null pointer\n"
                                      ;
                                    }
LAB_007e2b80:
                                    sStack_10 = 0x3d;
                                    goto LAB_007e2c94;
                                  }
                                  pcVar2 = 
                                  "error: output variable, out->v4rholapl3, is a null pointer\n";
                                  goto LAB_007e2c92;
                                }
                                pcVar2 = 
                                "error: output variable, out->v4rhosigmalapl2, is a null pointer\n";
                              }
                            }
LAB_007e2c55:
                            sStack_10 = 0x40;
                            goto LAB_007e2c94;
                          }
                          pcVar2 = "error: output variable, out->v4rho3lapl, is a null pointer\n";
LAB_007e2c92:
                          sStack_10 = 0x3b;
                        }
                        else {
LAB_007e252f:
                          if ((uVar1 >> 0x10 & 1) == 0) {
                            return;
                          }
                          if (out->v4rho3tau == (double *)0x0) {
                            pcVar2 = "error: output variable, out->v4rho3tau, is a null pointer\n";
                            goto LAB_007e2b68;
                          }
                          if (out->v4rho2sigmatau == (double *)0x0) {
                            pcVar2 = 
                            "error: output variable, out->v4rho2sigmatau, is a null pointer\n";
                          }
                          else {
                            if (out->v4rho2tau2 == (double *)0x0) {
                              pcVar2 = 
                              "error: output variable, out->v4rho2tau2, is a null pointer\n";
                              goto LAB_007e2c92;
                            }
                            if (out->v4rhosigma2tau == (double *)0x0) {
                              pcVar2 = 
                              "error: output variable, out->v4rhosigma2tau, is a null pointer\n";
                            }
                            else {
                              if (out->v4rhosigmatau2 != (double *)0x0) {
                                if (out->v4rhotau3 != (double *)0x0) {
                                  if (out->v4sigma3tau == (double *)0x0) {
                                    pcVar2 = 
                                    "error: output variable, out->v4sigma3tau, is a null pointer\n";
                                  }
                                  else {
                                    if (out->v4sigma2tau2 == (double *)0x0) {
                                      pcVar2 = 
                                      "error: output variable, out->v4sigma2tau2, is a null pointer\n"
                                      ;
                                      goto LAB_007e2b80;
                                    }
                                    if (out->v4sigmatau3 != (double *)0x0) {
                                      if (out->v4tau4 == (double *)0x0) {
                                        pcVar2 = 
                                        "error: output variable, out->v4tau4, is a null pointer\n";
                                        goto LAB_007e2b50;
                                      }
                                      if ((~uVar1 & 0x18000) != 0) {
                                        return;
                                      }
                                      if (out->v4rho2lapltau == (double *)0x0) {
                                        pcVar2 = 
                                        "error: output variable, out->v4rho2lapltau, is a null pointer\n"
                                        ;
                                      }
                                      else {
                                        if (out->v4rhosigmalapltau == (double *)0x0) {
                                          pcVar2 = 
                                          "error: output variable, out->v4rhosigmalapltau, is a null pointer\n"
                                          ;
                                          sStack_10 = 0x42;
                                          goto LAB_007e2c94;
                                        }
                                        if (out->v4rholapl2tau == (double *)0x0) {
                                          pcVar2 = 
                                          "error: output variable, out->v4rholapl2tau, is a null pointer\n"
                                          ;
                                        }
                                        else {
                                          if (out->v4rholapltau2 != (double *)0x0) {
                                            if (out->v4sigma2lapltau == (double *)0x0) {
                                              pcVar2 = 
                                              "error: output variable, out->v4sigma2lapltau, is a null pointer\n"
                                              ;
                                            }
                                            else if (out->v4sigmalapl2tau == (double *)0x0) {
                                              pcVar2 = 
                                              "error: output variable, out->v4sigmalapl2tau, is a null pointer\n"
                                              ;
                                            }
                                            else {
                                              if (out->v4sigmalapltau2 != (double *)0x0) {
                                                if (out->v4lapl3tau == (double *)0x0) {
                                                  pcVar2 = 
                                                  "error: output variable, out->v4lapl3tau, is a null pointer\n"
                                                  ;
                                                }
                                                else {
                                                  if (out->v4lapl2tau2 == (double *)0x0) {
                                                    pcVar2 = 
                                                  "error: output variable, out->v4lapl2tau2, is a null pointer\n"
                                                  ;
                                                  goto LAB_007e2c7d;
                                                  }
                                                  if (out->v4lapltau3 != (double *)0x0) {
                                                    return;
                                                  }
                                                  pcVar2 = 
                                                  "error: output variable, out->v4lapltau3, is a null pointer\n"
                                                  ;
                                                }
                                                goto LAB_007e2c92;
                                              }
                                              pcVar2 = 
                                              "error: output variable, out->v4sigmalapltau2, is a null pointer\n"
                                              ;
                                            }
                                            goto LAB_007e2c55;
                                          }
                                          pcVar2 = 
                                          "error: output variable, out->v4rholapltau2, is a null pointer\n"
                                          ;
                                        }
                                      }
LAB_007e2c1a:
                                      sStack_10 = 0x3e;
                                      goto LAB_007e2c94;
                                    }
                                    pcVar2 = 
                                    "error: output variable, out->v4sigmatau3, is a null pointer\n";
                                  }
                                  goto LAB_007e2c7d;
                                }
                                pcVar2 = 
                                "error: output variable, out->v4rhotau3, is a null pointer\n";
                                goto LAB_007e2b68;
                              }
                              pcVar2 = 
                              "error: output variable, out->v4rhosigmatau2, is a null pointer\n";
                            }
                          }
LAB_007e2b98:
                          sStack_10 = 0x3f;
                        }
                        goto LAB_007e2c94;
                      }
                      pcVar2 = "error: output variable, out->v4rhosigma3, is a null pointer\n";
                    }
                  }
                  goto LAB_007e2c7d;
                }
                pcVar2 = "error: output variable, out->v3rhotau2, is a null pointer\n";
              }
LAB_007e2b68:
              sStack_10 = 0x3a;
              goto LAB_007e2c94;
            }
            pcVar2 = "error: output variable, out->v3rhosigma2, is a null pointer\n";
          }
LAB_007e2c7d:
          sStack_10 = 0x3c;
        }
LAB_007e2c94:
        fwrite(pcVar2,sStack_10,1,_stderr);
        goto LAB_007e2c9d;
      }
      pcVar2 = info->name;
      __format = "Functional \'%s\' does not provide an implementation of fxc\n";
    }
    else {
      uVar1 = info->flags;
      if ((uVar1 & 2) != 0) {
        if (out->vsigma == (double *)0x0) {
          pcVar2 = "error: output variable, out->vsigma, is a null pointer\n";
LAB_007e2b50:
          sStack_10 = 0x37;
        }
        else if (((short)uVar1 < 0) && (out->vlapl == (double *)0x0)) {
          pcVar2 = "error: output variable, out->vlapl, is a null pointer\n";
          sStack_10 = 0x36;
        }
        else {
          if (((uVar1 >> 0x10 & 1) == 0) || (out->vtau != (double *)0x0)) goto LAB_007e2284;
          pcVar2 = "error: output variable, out->vtau, is a null pointer\n";
          sStack_10 = 0x35;
        }
        goto LAB_007e2c94;
      }
      pcVar2 = info->name;
      __format = "Functional \'%s\' does not provide an implementation of vxc\n";
    }
  }
  else {
    pcVar2 = info->name;
    __format = "Functional \'%s\' does not provide an implementation of Exc\n";
  }
LAB_007e277f:
  fprintf(_stderr,__format,pcVar2);
LAB_007e2c9d:
  exit(1);
}

Assistant:

void
xc_mgga_sanity_check(const xc_func_info_type *info, int order, xc_mgga_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
            order);
    exit(1);
  }
  
  /* sanity check */
  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_VXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
              info->name);
      exit(1);
    }
    check_out_var(vsigma);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(vlapl);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(vtau);
    }
  }

  if(out->v2rho2 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_FXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v2rhosigma); 
    check_out_var(v2sigma2);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v2rholapl);
      check_out_var(v2sigmalapl);
      check_out_var(v2lapl2);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v2rhotau);
      check_out_var(v2sigmatau);
      check_out_var(v2tau2);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v2lapltau);
    }
  }

  if(out->v3rho3 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_KXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v3rho2sigma);
    check_out_var(v3rhosigma2);
    check_out_var(v3sigma3);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v3rho2lapl);
      check_out_var(v3rhosigmalapl);
      check_out_var(v3rholapl2);
      check_out_var(v3sigma2lapl);
      check_out_var(v3sigmalapl2);
      check_out_var(v3lapl3);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v3rho2tau);
      check_out_var(v3rhosigmatau);
      check_out_var(v3rhotau2);
      check_out_var(v3sigma2tau);
      check_out_var(v3sigmatau2);
      check_out_var(v3tau3);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v3rholapltau);
      check_out_var(v3sigmalapltau);
      check_out_var(v3lapl2tau);
      check_out_var(v3lapltau2);
    }
  }

  if(out->v4rho4 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_LXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of lxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v4rho3sigma);
    check_out_var(v4rho2sigma2);
    check_out_var(v4rhosigma3);
    check_out_var(v4sigma4);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v4rho3lapl);
      check_out_var(v4rho2sigmalapl);
      check_out_var(v4rho2lapl2);
      check_out_var(v4rhosigma2lapl);
      check_out_var(v4rhosigmalapl2);
      check_out_var(v4rholapl3);
      check_out_var(v4sigma3lapl);
      check_out_var(v4sigma2lapl2);
      check_out_var(v4sigmalapl3);
      check_out_var(v4lapl4);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v4rho3tau);
      check_out_var(v4rho2sigmatau);
      check_out_var(v4rho2tau2);
      check_out_var(v4rhosigma2tau);
      check_out_var(v4rhosigmatau2);
      check_out_var(v4rhotau3);
      check_out_var(v4sigma3tau);
      check_out_var(v4sigma2tau2);
      check_out_var(v4sigmatau3);
      check_out_var(v4tau4);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v4rho2lapltau);
      check_out_var(v4rhosigmalapltau);
      check_out_var(v4rholapl2tau);
      check_out_var(v4rholapltau2);
      check_out_var(v4sigma2lapltau);
      check_out_var(v4sigmalapl2tau);
      check_out_var(v4sigmalapltau2);
      check_out_var(v4lapl3tau);
      check_out_var(v4lapl2tau2);
      check_out_var(v4lapltau3); 
    }
  }
}